

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

void __thiscall f8n::db::Statement::BindText(Statement *this,int position,char *bindText)

{
  sqlite3_bind_text(this->stmt,position + 1,bindText,-1,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

void Statement::BindText(int position, const char* bindText) {
    sqlite3_bind_text(
        this->stmt,
        position + 1,
        bindText,
        -1,
        SQLITE_STATIC);
}